

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O0

char * google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>
                 (void *object,char *ptr,ParseContext *ctx,EnumValidityFuncWithArg *is_valid,
                 void *data,InternalMetadata *metadata,int field_num)

{
  anon_class_40_5_beb31822 add;
  char *pcVar1;
  undefined4 uStack_3c;
  InternalMetadata *metadata_local;
  void *data_local;
  EnumValidityFuncWithArg *is_valid_local;
  ParseContext *ctx_local;
  char *ptr_local;
  void *object_local;
  
  add._36_4_ = uStack_3c;
  add.field_num = field_num;
  add.is_valid = is_valid;
  add.object = object;
  add.data = data;
  add.metadata = metadata;
  pcVar1 = EpsCopyInputStream::
           ReadPackedVarint<google::protobuf::internal::PackedEnumParserArg<std::__cxx11::string>(void*,char_const*,google::protobuf::internal::ParseContext*,bool(*)(void_const*,int),void_const*,google::protobuf::internal::InternalMetadata*,int)::_lambda(unsigned_long)_1_>
                     (&ctx->super_EpsCopyInputStream,ptr,add);
  return pcVar1;
}

Assistant:

PROTOBUF_NODISCARD const char* PackedEnumParserArg(
    void* object, const char* ptr, ParseContext* ctx,
    bool (*is_valid)(const void*, int), const void* data,
    InternalMetadata* metadata, int field_num) {
  return ctx->ReadPackedVarint(
      ptr, [object, is_valid, data, metadata, field_num](uint64_t val) {
        if (is_valid(data, val)) {
          static_cast<RepeatedField<int>*>(object)->Add(val);
        } else {
          WriteVarint(field_num, val, metadata->mutable_unknown_fields<T>());
        }
      });
}